

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall pbrt::SubSurfaceMaterial::readFrom(SubSurfaceMaterial *this,BinaryReader *binary)

{
  size_t in_RCX;
  void *__buf;
  
  Material::readFrom(&this->super_Material,binary);
  BinaryReader::read<float,void>(binary,&this->uRoughness);
  BinaryReader::read<float,void>(binary,&this->vRoughness);
  BinaryReader::read<bool,void>(binary,&this->remapRoughness);
  BinaryReader::read(binary,(int)this + 0x48,__buf,in_RCX);
  return;
}

Assistant:

void SubSurfaceMaterial::readFrom(BinaryReader &binary) 
  {
    Material::readFrom(binary);
    binary.read(uRoughness);
    binary.read(vRoughness);
    binary.read(remapRoughness);
    binary.read(name);
  }